

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipkinCollector.cpp
# Opt level: O3

ssize_t __thiscall
twitter::zipkin::thrift::ZipkinCollector_submitZipkinBatch_pargs::write
          (ZipkinCollector_submitZipkinBatch_pargs *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  vector<twitter::zipkin::thrift::Span,_std::allocator<twitter::zipkin::thrift::Span>_> *pvVar6;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  pointer pSVar7;
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  apache::thrift::protocol::TProtocol::incrementOutputRecursionDepth(this_00);
  iVar1 = (*this_00->_vptr_TProtocol[4])(this_00,"ZipkinCollector_submitZipkinBatch_pargs");
  iVar2 = (*this_00->_vptr_TProtocol[6])(this_00,"spans",0xf,1);
  iVar3 = (*this_00->_vptr_TProtocol[0xb])
                    (this_00,0xc,
                     (ulong)(uint)((int)((ulong)((long)(this->spans->
                                                                                                              
                                                  super__Vector_base<twitter::zipkin::thrift::Span,_std::allocator<twitter::zipkin::thrift::Span>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                                (long)(this->spans->
                                                                                                            
                                                  super__Vector_base<twitter::zipkin::thrift::Span,_std::allocator<twitter::zipkin::thrift::Span>_>
                                                  )._M_impl.super__Vector_impl_data._M_start) >> 3)
                                  * 0x286bca1b));
  iVar3 = iVar2 + iVar1 + iVar3;
  pvVar6 = this->spans;
  for (pSVar7 = (pvVar6->
                super__Vector_base<twitter::zipkin::thrift::Span,_std::allocator<twitter::zipkin::thrift::Span>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pSVar7 != (pvVar6->
                super__Vector_base<twitter::zipkin::thrift::Span,_std::allocator<twitter::zipkin::thrift::Span>_>
                )._M_impl.super__Vector_impl_data._M_finish; pSVar7 = pSVar7 + 1) {
    iVar1 = (**(code **)(*(long *)pSVar7 + 0x18))(pSVar7,this_00);
    iVar3 = iVar3 + iVar1;
    pvVar6 = this->spans;
  }
  iVar1 = (*this_00->_vptr_TProtocol[0xc])(this_00);
  iVar2 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar4 = (*this_00->_vptr_TProtocol[8])(this_00);
  iVar5 = (*this_00->_vptr_TProtocol[5])(this_00);
  this_00->output_recursion_depth_ = this_00->output_recursion_depth_ - 1;
  return (ulong)(uint)(iVar2 + iVar4 + iVar5 + iVar1 + iVar3);
}

Assistant:

uint32_t ZipkinCollector_submitZipkinBatch_pargs::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("ZipkinCollector_submitZipkinBatch_pargs");

  xfer += oprot->writeFieldBegin("spans", ::apache::thrift::protocol::T_LIST, 1);
  {
    xfer += oprot->writeListBegin(::apache::thrift::protocol::T_STRUCT, static_cast<uint32_t>((*(this->spans)).size()));
    std::vector<Span> ::const_iterator _iter29;
    for (_iter29 = (*(this->spans)).begin(); _iter29 != (*(this->spans)).end(); ++_iter29)
    {
      xfer += (*_iter29).write(oprot);
    }
    xfer += oprot->writeListEnd();
  }
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}